

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeVirtualMemGetAccessAttribute
          (ze_context_handle_t hContext,void *ptr,size_t size,ze_memory_access_attribute_t *access,
          size_t *outSize)

{
  _func_void__ze_virtual_mem_get_access_attribute_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_context_handle_t_ptr_void_ptr_unsigned_long__ze_memory_access_attribute_t_ptr_unsigned_long_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_120;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_108;
  undefined1 local_f0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnVirtualMemGetAccessAttributeCb_t epilogue_callback_ptr;
  ze_pfnVirtualMemGetAccessAttributeCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_virtual_mem_get_access_attribute_params_t tracerParams;
  ze_pfnVirtualMemGetAccessAttribute_t pfnGetAccessAttribute;
  size_t *outSize_local;
  ze_memory_access_attribute_t *access_local;
  size_t size_local;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  if (DAT_002da858 ==
      (_func__ze_result_t__ze_context_handle_t_ptr_void_ptr_unsigned_long__ze_memory_access_attribute_t_ptr_unsigned_long_ptr
       *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnGetAccessAttribute = (ze_pfnVirtualMemGetAccessAttribute_t)outSize;
    outSize_local = (size_t *)access;
    access_local = (ze_memory_access_attribute_t *)size;
    size_local = (size_t)ptr;
    ptr_local = hContext;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&ptr_local;
      APITracerCallbackDataImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnVirtualMemGetAccessAttributeCb_t)0x0;
            prologueCallbackPtr < (ze_pfnVirtualMemGetAccessAttributeCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x618);
          p_Var1 = *(_func_void__ze_virtual_mem_get_access_attribute_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0xc70);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_virtual_mem_get_access_attribute_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_f0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_f0)
          ;
        }
      }
      zeApiPtr = DAT_002da858;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_108,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_120,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hContext_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,void_const*,unsigned_long,_ze_memory_access_attribute_t*,unsigned_long*),_ze_virtual_mem_get_access_attribute_params_t*,void(*)(_ze_virtual_mem_get_access_attribute_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_virtual_mem_get_access_attribute_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_virtual_mem_get_access_attribute_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_virtual_mem_get_access_attribute_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_virtual_mem_get_access_attribute_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,void_const*&,unsigned_long&,_ze_memory_access_attribute_t*&,unsigned_long*&>
                     (zeApiPtr,(_ze_virtual_mem_get_access_attribute_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_virtual_mem_get_access_attribute_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_108,&local_120,
                      (_ze_context_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(void **)&size_local,
                      (unsigned_long *)&access_local,
                      (_ze_memory_access_attribute_t **)&outSize_local,
                      (unsigned_long **)&pfnGetAccessAttribute);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_120);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_108);
      APITracerCallbackDataImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_virtual_mem_get_access_attribute_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hContext_local._4_4_ =
           (*DAT_002da858)((_ze_context_handle_t *)ptr_local,(void *)size_local,
                           (unsigned_long)access_local,
                           (_ze_memory_access_attribute_t *)outSize_local,
                           (unsigned_long *)pfnGetAccessAttribute);
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemGetAccessAttribute(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to start of virtual address region for query.
        size_t size,                                    ///< [in] size in bytes; must be page aligned.
        ze_memory_access_attribute_t* access,           ///< [out] query result for page access attribute.
        size_t* outSize                                 ///< [out] query result for size of virtual address range, starting at ptr,
                                                        ///< that shares same access attribute.
        )
    {
        auto pfnGetAccessAttribute = context.zeDdiTable.VirtualMem.pfnGetAccessAttribute;

        if( nullptr == pfnGetAccessAttribute)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.VirtualMem.pfnGetAccessAttribute, hContext, ptr, size, access, outSize);

        // capture parameters
        ze_virtual_mem_get_access_attribute_params_t tracerParams = {
            &hContext,
            &ptr,
            &size,
            &access,
            &outSize
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnVirtualMemGetAccessAttributeCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnVirtualMemGetAccessAttributeCb_t, VirtualMem, pfnGetAccessAttributeCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.VirtualMem.pfnGetAccessAttribute,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.pptr,
                                                  *tracerParams.psize,
                                                  *tracerParams.paccess,
                                                  *tracerParams.poutSize);
    }